

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::SubroutineSymbol_const*>::
emplace_back<slang::ast::SubroutineSymbol_const*>
          (SmallVectorBase<const_slang::ast::SubroutineSymbol_*> *this,SubroutineSymbol **args)

{
  iterator ppSVar1;
  undefined8 *in_RSI;
  SmallVectorBase<const_slang::ast::SubroutineSymbol_*> *in_RDI;
  SubroutineSymbol **in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<const_slang::ast::SubroutineSymbol_*> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<const_slang::ast::SubroutineSymbol_*>::end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::SubroutineSymbol_const*>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppSVar1 = SmallVectorBase<const_slang::ast::SubroutineSymbol_*>::end(in_RDI);
    *ppSVar1 = (SubroutineSymbol *)*in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<const_slang::ast::SubroutineSymbol_*>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }